

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

int32_t ecs_next_pow_of_2(int32_t n)

{
  uint uVar1;
  
  uVar1 = (int)(n - 1U) >> 1 | n - 1U;
  uVar1 = (int)uVar1 >> 2 | uVar1;
  uVar1 = (int)uVar1 >> 4 | uVar1;
  uVar1 = (int)uVar1 >> 8 | uVar1;
  return ((int)uVar1 >> 0x10 | uVar1) + 1;
}

Assistant:

int32_t ecs_next_pow_of_2(
    int32_t n)
{
    n --;
    n |= n >> 1;
    n |= n >> 2;
    n |= n >> 4;
    n |= n >> 8;
    n |= n >> 16;
    n ++;

    return n;
}